

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O1

void compute_response_layer_unconditional_strided(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  float *pfVar4;
  bool *pbVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  float *pfVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  int c0;
  int iVar20;
  int iVar21;
  float *pfVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  float *data_3;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  float *pfVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  float *pfVar41;
  int iVar42;
  float *data;
  int iVar43;
  long lVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  ulong local_1a0;
  float *local_198;
  long local_150;
  int local_f0;
  float *local_c8;
  
  pfVar4 = layer->response;
  iVar1 = layer->step;
  lVar44 = (long)iVar1;
  iVar43 = layer->filter_size;
  iVar2 = layer->height;
  iVar36 = iVar43 >> 0x1f;
  iVar33 = iVar43 / 3 + iVar36;
  uVar28 = iVar33 - iVar36;
  uVar29 = (long)((iVar33 + 1) - iVar36) / (long)iVar1;
  uVar13 = uVar29 & 0xffffffff;
  uVar3 = layer->width;
  lVar14 = (long)(int)uVar3;
  uVar38 = (ulong)uVar3;
  fVar45 = 1.0 / (float)(iVar43 * iVar43);
  if (0 < (long)iVar2) {
    pbVar5 = layer->laplacian;
    uVar11 = (iVar43 + -1) - (iVar43 + -1 >> 0x1f) >> 1;
    iVar20 = (iVar43 + -1) - uVar11;
    uVar11 = ~uVar11;
    iVar30 = -uVar28;
    iVar32 = uVar28 - 1;
    iVar35 = iVar32 - iVar43 / 6;
    uVar16 = ~(iVar43 / 6);
    iVar26 = 0;
    iVar21 = 0;
    iVar43 = iVar20;
    uVar39 = uVar16;
    uVar27 = uVar11;
    iVar33 = iVar32;
    iVar36 = iVar35;
    do {
      if (0 < (int)uVar3) {
        pfVar6 = iimage->data;
        iVar18 = iimage->data_width;
        iVar42 = iVar18 * iVar30;
        iVar12 = iVar18 * iVar33;
        pfVar22 = pfVar6 + -(long)(int)uVar28;
        iVar31 = 0;
        uVar40 = 0;
        do {
          auVar9 = vfmadd213ss_fma(ZEXT416((uint)((pfVar6[(int)(uVar16 + iVar42 + iVar31)] -
                                                  pfVar6[(int)(uVar16 + iVar12 + iVar31)]) +
                                                 (pfVar6[iVar35 + iVar12 + iVar31] -
                                                 pfVar6[iVar35 + iVar42 + iVar31]))),
                                   SUB6416(ZEXT464(0xc0400000),0),
                                   ZEXT416((uint)((pfVar6[(int)(uVar11 + iVar42 + iVar31)] -
                                                  pfVar6[(int)(uVar11 + iVar12 + iVar31)]) +
                                                 (pfVar6[iVar12 + iVar20 + iVar31] -
                                                 pfVar6[iVar42 + iVar20 + iVar31]))));
          auVar10 = vfmadd213ss_fma(ZEXT416((uint)((pfVar6[iVar18 * iVar36 + iVar32 + iVar31] -
                                                   pfVar6[(int)(iVar32 + iVar18 * uVar39 + iVar31)])
                                                  + (pfVar22[(int)(iVar18 * uVar39)] -
                                                    pfVar22[iVar18 * iVar36]))),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)((pfVar22[(int)(iVar18 * uVar27)] -
                                                   pfVar22[iVar18 * iVar43]) +
                                                  (pfVar6[iVar18 * iVar43 + iVar32 + iVar31] -
                                                  pfVar6[(int)(iVar18 * uVar27 + iVar32 + iVar31)]))
                                           ));
          fVar46 = fVar45 * auVar9._0_4_;
          fVar47 = fVar45 * auVar10._0_4_;
          pfVar4[(long)iVar21 + uVar40] = fVar46 * fVar47;
          pbVar5[uVar40 + (long)iVar21] = 0.0 <= fVar46 + fVar47;
          uVar40 = uVar40 + 1;
          iVar31 = iVar31 + iVar1;
          pfVar22 = pfVar22 + lVar44;
        } while (uVar38 != uVar40);
        iVar21 = iVar21 + (int)uVar40;
      }
      iVar26 = iVar26 + 1;
      iVar30 = iVar30 + iVar1;
      iVar33 = iVar33 + iVar1;
      iVar36 = iVar36 + iVar1;
      uVar39 = uVar39 + iVar1;
      iVar43 = iVar43 + iVar1;
      uVar27 = uVar27 + iVar1;
    } while (iVar26 != iVar2);
  }
  local_f0 = (int)uVar29;
  if (0 < local_f0) {
    uVar29 = (ulong)(uint)(local_f0 * 0xc);
    iVar33 = iVar2 + local_f0 * -0xc;
    uVar27 = ~uVar28;
    iVar43 = local_f0 * iVar1;
    lVar19 = 0;
    uVar40 = 0;
    pfVar22 = pfVar4;
    uVar39 = uVar28;
    do {
      iVar36 = (int)uVar40;
      local_1a0 = uVar40;
      local_150 = lVar19;
      local_c8 = pfVar22;
      uVar11 = uVar39;
      if (iVar36 <= iVar33) {
        do {
          if (0 < (int)uVar3) {
            iVar20 = (int)local_1a0 * iVar1;
            pfVar6 = iimage->data;
            iVar36 = iimage->data_width;
            iVar26 = (iVar20 + uVar27) * iVar36;
            iVar20 = (iVar20 + -1) * iVar36;
            lVar25 = 0;
            iVar30 = -1;
            iVar21 = 0;
            uVar37 = 0;
            pfVar15 = local_c8;
            uVar16 = uVar28;
            uVar17 = uVar27;
            do {
              lVar23 = uVar37 * lVar44;
              iVar32 = (int)lVar23;
              fVar46 = (pfVar6[iVar26 + lVar23] - pfVar6[iVar20 + lVar23]) +
                       (pfVar6[(int)(iVar20 + uVar28 + iVar32)] -
                       pfVar6[(int)(uVar28 + iVar32 + iVar26)]);
              uVar24 = local_1a0;
              pfVar34 = (float *)(local_150 * iVar36 + (long)pfVar6);
              pfVar41 = pfVar15;
              fVar47 = (pfVar6[(int)(iVar26 + iVar32 + uVar27)] -
                       pfVar6[(int)(iVar32 + uVar27 + iVar20)]) +
                       (pfVar6[iVar20 + -1 + iVar32] - pfVar6[iVar26 + -1 + iVar32]);
              iVar32 = iVar36 * uVar11;
              do {
                fVar7 = (pfVar34[(int)uVar17] - pfVar6[(int)(uVar17 + iVar32)]) +
                        (pfVar6[iVar21 + -1 + iVar32] - pfVar34[iVar30]);
                fVar8 = fVar46 + fVar7;
                fVar46 = (*(float *)((long)pfVar34 + lVar25) - pfVar6[lVar23 + iVar32]) +
                         (pfVar6[(int)(uVar16 + iVar32)] - pfVar34[(int)uVar16]);
                fVar47 = fVar45 * ((fVar8 - fVar47) - fVar46);
                auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar47 * -0.81)),ZEXT416((uint)fVar47),
                                         ZEXT416((uint)*pfVar41));
                *pfVar41 = auVar9._0_4_;
                uVar24 = uVar24 + uVar13;
                pfVar41 = pfVar41 + lVar14 * uVar13;
                iVar32 = iVar32 + iVar1 * local_f0 * iVar36;
                pfVar34 = (float *)((long)pfVar34 + (long)iVar36 * lVar44 * uVar13 * 4);
                fVar47 = fVar7;
              } while (uVar24 < uVar29 + local_1a0);
              uVar37 = uVar37 + 1;
              pfVar15 = pfVar15 + 1;
              uVar16 = uVar16 + iVar1;
              iVar21 = iVar21 + iVar1;
              uVar17 = uVar17 + iVar1;
              lVar25 = lVar25 + lVar44 * 4;
              iVar30 = iVar30 + iVar1;
            } while (uVar37 != uVar38);
          }
          local_1a0 = local_1a0 + uVar29;
          local_c8 = local_c8 + lVar14 * uVar29;
          uVar11 = uVar11 + local_f0 * 0xc * iVar1;
          local_150 = local_150 + lVar44 * uVar29 * 4;
        } while ((long)local_1a0 <= (long)iVar33);
        iVar36 = (int)local_1a0;
      }
      if (iVar36 < iVar2) {
        lVar25 = (long)iVar36;
        local_198 = (float *)(lVar14 * 4 * lVar25 + (long)pfVar4);
        iVar36 = iVar36 * iVar1;
        iVar20 = uVar28 + iVar36;
        iVar21 = iVar36 + -1;
        iVar26 = uVar27 + iVar36;
        do {
          if (0 < (int)uVar3) {
            pfVar6 = iimage->data;
            iVar30 = iimage->data_width;
            iVar32 = iVar30 * iVar20;
            iVar35 = iVar30 * iVar36;
            iVar18 = iVar30 * iVar21;
            iVar30 = iVar30 * iVar26;
            iVar12 = 0;
            pfVar15 = pfVar6;
            uVar37 = uVar38;
            pfVar34 = local_198;
            do {
              fVar46 = fVar45 * ((((pfVar15[iVar30] - pfVar15[iVar18]) +
                                   (pfVar6[(int)(iVar18 + uVar28 + iVar12)] -
                                   pfVar6[(int)(uVar28 + iVar30 + iVar12)]) +
                                  (pfVar6[(int)(uVar27 + iVar35 + iVar12)] -
                                  pfVar6[(int)(uVar27 + iVar32 + iVar12)]) +
                                  (pfVar6[iVar32 + -1 + iVar12] - pfVar6[iVar35 + -1 + iVar12])) -
                                 ((pfVar6[(int)(uVar27 + iVar30 + iVar12)] -
                                  pfVar6[(int)(uVar27 + iVar18 + iVar12)]) +
                                 (pfVar6[iVar18 + -1 + iVar12] - pfVar6[iVar30 + -1 + iVar12]))) -
                                ((pfVar15[iVar35] - pfVar15[iVar32]) +
                                (pfVar6[(int)(iVar32 + uVar28 + iVar12)] -
                                pfVar6[(int)(uVar28 + iVar35 + iVar12)])));
              auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar46 * -0.81)),ZEXT416((uint)fVar46),
                                       ZEXT416((uint)*pfVar34));
              *pfVar34 = auVar9._0_4_;
              pfVar34 = pfVar34 + 1;
              pfVar15 = pfVar15 + lVar44;
              iVar12 = iVar12 + iVar1;
              uVar37 = uVar37 - 1;
            } while (uVar37 != 0);
          }
          lVar25 = lVar25 + uVar13;
          local_198 = local_198 + lVar14 * uVar13;
          iVar20 = iVar20 + iVar43;
          iVar36 = iVar36 + iVar43;
          iVar21 = iVar21 + iVar43;
          iVar26 = iVar26 + iVar43;
        } while (lVar25 < iVar2);
      }
      uVar40 = uVar40 + 1;
      pfVar22 = pfVar22 + lVar14;
      uVar39 = uVar39 + iVar1;
      lVar19 = lVar19 + lVar44 * 4;
    } while (uVar40 != uVar13);
  }
  return;
}

Assistant:

void compute_response_layer_unconditional_strided(struct response_layer *layer, struct integral_image *iimage) {
    /*
    base function: compute_response_layer_unconditional

    optimizations:
        - Computes Dxy in a strided manner (reusing parts), as a result eliminates unnecessary
            recomputations
    */

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size/3;
    int border = (filter_size-1)/2;
    float inv_area = 1.f/(filter_size*filter_size);

    int Dxy_stride = (lobe+1)/step;
    // printf("\nDxy_stride: lobe+1:%d step:%d Dxy_stride:%d\n", lobe+1, step, Dxy_stride);

    // int Dxx_col_stride = lobe/step;
    // printf("Dyy_row_stride/Dxx_col_stride: lobe:%d step:%d Dxx_col_stride:%d\n", lobe, step, Dxx_col_stride);

    int Dxx_col_stride = (2*lobe)/step;
    // printf("2*Dyy_row_stride/2*Dxx_col_stride: lobe:%d step:%d 2*Dxx_col_stride:%d\n", lobe, step, Dxx_col_stride);

    // int Dxx_row_stride = (2*lobe - 1)/step;
    // printf("Dyy_col_stride/Dxx_row_stride: 2*lobe-1:%d step:%d Dxx_row_stride:%d\n", 2*lobe-1, step, Dxx_row_stride);

    // int Dyy_col_stride = (2*lobe - 1)/step;
    int Dyy_row_stride = (2*lobe)/step;

    for (int i = 0, ind = 0; i < height; ++i) {
        int x = i*step;
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            int y = j*step;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy;
            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0);
        }
    }
    /*
    {
        int i_unroll = 24;
    // printf("\n");
    // printf("Dyy_row_stride %d step %d \n", Dyy_row_stride, step);
    // for (int i_offset=0; i_offset<Dyy_row_stride-i_unroll+1; i_offset+=i_unroll) {
        int i_offset=0;
        for (; i_offset<Dyy_row_stride; i_offset+=1) {
            // printf("j_offset: %d - %d ", j_offset, j_offset+j_unroll-1);
            int i = i_offset;
            for (; i < height-(Dyy_row_stride*i_unroll)+1; i+=Dyy_row_stride*i_unroll) {

                for (int j = 0; j < width; j++) {
                    int y = j*step;
                    int x = i*step;
                    for (int ii = i; ii<i+(Dyy_row_stride*i_unroll); ii+=Dyy_row_stride) {
                        // Image coordinates
                        int x = ii*step;

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                                - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dyy *= inv_area;

                        // Calculate Determinant
                        response[ii*width + j] = Dxx * Dyy;
                        // Calculate Laplacian
                        laplacian[ii*width + j] = (Dxx + Dyy >= 0);
                    }
                }
            }

            for (; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j++) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                            - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                    float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                            - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

                    // Normalize Responses with inverse area
                    Dxx *= inv_area;
                    Dyy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] = Dxx * Dyy;
                    // Calculate Laplacian
                    laplacian[i*width + j] = (Dxx + Dyy >= 0);

                }

            }
        }
    }
    */



    // strided Dxy
    {
        int i_unroll = 12;
    // printf("\n");
    // printf("Dxy_stride %d step %d \n", Dxy_stride, step);
    // for (int i_offset=0; i_offset<Dxy_stride-i_unroll+1; i_offset+=i_unroll) {
        int i_offset=0;
        /**/
        for (; i_offset<Dxy_stride; i_offset+=1) {
            // printf("j_offset: %d - %d ", j_offset, j_offset+j_unroll-1);
            int i = i_offset;
            for (; i < height-(Dxy_stride*i_unroll)+1; i+=Dxy_stride*i_unroll) {

                for (int j = 0; j < width; j++) {
                    int y = j*step;
                    int x = i*step;
                    float bottom_left = box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe);
                    float bottom_right = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe);
                    for (int ii = i; ii<i+(Dxy_stride*i_unroll); ii+=Dxy_stride) {
                        // Image coordinates
                        int x = ii*step;

                        float top_left = bottom_left;//box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe);
                        float top_right = bottom_right;//box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe);

                        bottom_left = box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe);
                        bottom_right = box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);


                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        float Dxy = top_right //box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + bottom_left //box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - top_left //box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - bottom_right; //box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                        // Normalize Responses with inverse area
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ii*width + j] -= 0.81f * Dxy * Dxy;
                        // printf("ii:%d ",ii);
                    }
                }
            }
            // printf("i:%d \n",i);

            for (; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j++) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                            + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                    // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                    // Normalize Responses with inverse area
                    Dxy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] -= 0.81f * Dxy * Dxy;

                }

            }
        }
    }
        /**/
        /*
        for (; i_offset<Dxy_stride; i_offset+=1) {
            // printf("j_offset: %d ", j_offset);
            for (int i = i_offset; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j+=1) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                            + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                    // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                    // Normalize Responses with inverse area
                    Dxy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] -= 0.81f * Dxy * Dxy;

                }

            }
        }
        */
    // }
}